

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_std_popen(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  char *__command;
  char *__s;
  size_t sVar1;
  FILE *f;
  int *piVar2;
  ulong uVar3;
  int err;
  ulong uVar4;
  JSValue JVar5;
  int64_t iStack_40;
  
  __command = JS_ToCString(ctx,*argv);
  if (__command == (char *)0x0) {
LAB_0010f183:
    __s = (char *)0x0;
LAB_0010f186:
    JS_FreeCString(ctx,__command);
    JS_FreeCString(ctx,__s);
    iStack_40 = 6;
  }
  else {
    __s = JS_ToCString(ctx,argv[1]);
    if (__s == (char *)0x0) goto LAB_0010f183;
    sVar1 = strspn(__s,"rw");
    if (__s[sVar1] != '\0') {
      JS_ThrowTypeError(ctx,"invalid file mode");
      goto LAB_0010f186;
    }
    f = popen(__command,__s);
    err = 0;
    if (f == (FILE *)0x0) {
      piVar2 = __errno_location();
      err = *piVar2;
    }
    if (2 < argc) {
      js_set_error_object(ctx,argv[2],err);
    }
    JS_FreeCString(ctx,__command);
    JS_FreeCString(ctx,__s);
    if (f != (FILE *)0x0) {
      JVar5 = js_new_std_file(ctx,(FILE *)f,1,1);
      iStack_40 = JVar5.tag;
      uVar4 = (ulong)JVar5.u.ptr & 0xffffffff00000000;
      uVar3 = (ulong)JVar5.u._0_4_;
      goto LAB_0010f1a3;
    }
    iStack_40 = 2;
  }
  uVar3 = 0;
  uVar4 = 0;
LAB_0010f1a3:
  JVar5.u.ptr = (void *)(uVar3 | uVar4);
  JVar5.tag = iStack_40;
  return JVar5;
}

Assistant:

static JSValue js_std_popen(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    const char *filename, *mode = NULL;
    FILE *f;
    int err;
    
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        goto fail;
    mode = JS_ToCString(ctx, argv[1]);
    if (!mode)
        goto fail;
    if (mode[strspn(mode, "rw")] != '\0') {
        JS_ThrowTypeError(ctx, "invalid file mode");
        goto fail;
    }

    f = popen(filename, mode);
    if (!f)
        err = errno;
    else
        err = 0;
    if (argc >= 3)
        js_set_error_object(ctx, argv[2], err);
    JS_FreeCString(ctx, filename);
    JS_FreeCString(ctx, mode);
    if (!f)
        return JS_NULL;
    return js_new_std_file(ctx, f, TRUE, TRUE);
 fail:
    JS_FreeCString(ctx, filename);
    JS_FreeCString(ctx, mode);
    return JS_EXCEPTION;
}